

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int lhCursorData(unqlite_kv_cursor *pCursor,_func_int_void_ptr_uint_void_ptr *xConsumer,
                void *pUserData)

{
  unqlite_kv_engine *puVar1;
  long *plVar2;
  long *plVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  bool bVar8;
  unqlite_kv_io *puVar9;
  lhash_kv_cursor *pCur;
  void *pvVar10;
  unqlite_kv_io *puVar11;
  long *plStack_48;
  void *pvStack_40;
  unqlite_kv_io *puStack_38;
  
  if ((*(int *)&pCursor[1].pStore != 2) ||
     (puVar1 = pCursor[2].pStore, puVar1 == (unqlite_kv_engine *)0x0)) {
    return -9;
  }
  if (puVar1[3].pIo == (unqlite_kv_io *)0x0) {
    iVar6 = (*xConsumer)((puVar1[4].pIo)->pMethods->zName +
                         (ulong)(*(int *)((long)&puVar1->pIo + 4) + 0x1a) +
                         (ulong)*(ushort *)&puVar1[5].pIo,*(uint *)&puVar1[1].pIo,pUserData);
    iVar4 = -10;
    if (iVar6 == 0) {
      iVar4 = 0;
    }
  }
  else {
    plVar2 = (long *)(puVar1[4].pIo)->pHandle;
    puVar11 = puVar1[1].pIo;
    puStack_38 = puVar1[6].pIo;
    bVar8 = true;
    pvStack_40 = pUserData;
    while ((puStack_38 != (unqlite_kv_io *)0x0 && (puVar11 != (unqlite_kv_io *)0x0))) {
      iVar4 = (*(code *)((undefined8 *)*plVar2)[2])(*(undefined8 *)*plVar2,puStack_38,&plStack_48);
      if (iVar4 != 0) {
        return iVar4;
      }
      if (bVar8) {
        pvVar10 = (void *)(*plStack_48 + (ulong)*(ushort *)&puVar1[7].pIo);
        uVar5 = (int)plVar2[0x22] - (uint)*(ushort *)&puVar1[7].pIo;
      }
      else {
        pvVar10 = (void *)(*plStack_48 + 8);
        uVar5 = (int)plVar2[0x22] - 8;
      }
      puVar9 = (unqlite_kv_io *)(ulong)uVar5;
      if (puVar11 < puVar9 ||
          (unqlite_kv_io *)((long)puVar11 - (long)puVar9) == (unqlite_kv_io *)0x0) {
        iVar4 = (*xConsumer)(pvVar10,(uint)puVar11,pvStack_40);
        if (iVar4 != 0) {
          lVar7 = *plVar2;
          goto LAB_00113f86;
        }
        puVar11 = (unqlite_kv_io *)0x0;
      }
      else if ((puVar9 != (unqlite_kv_io *)0x0) &&
              (iVar4 = (*xConsumer)(pvVar10,uVar5,pvStack_40),
              puVar11 = (unqlite_kv_io *)((long)puVar11 - (long)puVar9), iVar4 != 0)) {
        lVar7 = *plVar2;
LAB_00113f86:
        (**(code **)(lVar7 + 0x50))(plStack_48);
        return -10;
      }
      plVar3 = plStack_48;
      SyBigEndianUnpack64((uchar *)*plStack_48,(sxu64 *)&puStack_38);
      (**(code **)(*plVar2 + 0x50))(plVar3);
      bVar8 = false;
    }
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

static int lhCursorData(unqlite_kv_cursor *pCursor,int (*xConsumer)(const void *,unsigned int,void *),void *pUserData)
{
	lhash_kv_cursor *pCur = (lhash_kv_cursor *)pCursor;
	lhcell *pCell;
	int rc;
	if( pCur->iState != L_HASH_CURSOR_STATE_CELL || pCur->pCell == 0 ){
		/* Invalid state */
		return UNQLITE_INVALID;
	}
	/* Point to the target cell */
	pCell = pCur->pCell;
	/* Consume the data */
	rc = lhConsumeCellData(pCell,xConsumer,pUserData);
	return rc;
}